

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_view.hpp
# Opt level: O2

file_view_sptr __thiscall
vfs::open_read_write_view
          (vfs *this,path *fileName,file_creation_options creationOptions,file_flags fileFlags,
          file_attributes fileAttributes,int64_t viewSize)

{
  stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  file_view_sptr fVar1;
  file_sptr spFile;
  int64_t viewSize_local;
  
  viewSize_local = viewSize;
  open_read_write((vfs *)&spFile,fileName,creationOptions,fileFlags,fileAttributes);
  if (((spFile.
        super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_file_interface<vfs::posix_file>).super_posix_file.fileDescriptor_ == -1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    this_00 = (stream_interface<vfs::file_view_interface<vfs::posix_file_view>> *)operator_new(0x60)
    ;
    stream_interface<vfs::file_view_interface<vfs::posix_file_view>>::
    stream_interface<std::shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>>>,long&>
              (this_00,&spFile,&viewSize_local);
    std::
    __shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>,(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>,void>
              ((__shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(stream_interface<vfs::file_view_interface<vfs::posix_file_view>_> *)this_00)
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&spFile.
              super___shared_ptr<vfs::stream_interface<vfs::file_interface<vfs::posix_file>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  fVar1.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar1.
  super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (file_view_sptr)
         fVar1.
         super___shared_ptr<vfs::stream_interface<vfs::file_view_interface<vfs::posix_file_view>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline auto open_read_write_view
    (
        const path              &fileName,
        file_creation_options   creationOptions,
        file_flags              fileFlags = file_flags::none,
        file_attributes         fileAttributes = file_attributes::normal,
        int64_t                 viewSize = 0
    )
    {
        auto spFile = open_read_write(fileName, creationOptions, fileFlags, fileAttributes);
        return spFile->isValid() ? file_view_sptr(new file_view_stream(std::move(spFile), viewSize)) : nullptr;
    }